

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ssl_add_clienthello_tlsext
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_encoded,bool *out_needs_psk_binder,
               ssl_client_hello_type_t type,size_t header_len)

{
  SSL *pSVar1;
  SSL *pSVar2;
  SSL_HANDSHAKE *pSVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  uint16_t uVar7;
  int iVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  uint8_t *puVar13;
  EVP_MD *md;
  undefined4 extraout_var;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  byte bVar17;
  long lVar18;
  CBB extensions;
  CBB extensions_1;
  ScopedCBB outer_extensions;
  CBB extensions_encoded;
  CBB extension;
  ulong local_188;
  CBB local_160;
  SSL_HANDSHAKE *local_130;
  SSL *local_128;
  CBB local_120;
  CBB local_f0;
  CBB local_c0;
  CBB local_90;
  CBB local_60;
  
  *out_needs_psk_binder = false;
  if (type != ssl_client_hello_inner) {
    if (out_encoded != (CBB *)0x0) {
      __assert_fail("out_encoded == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xf22,
                    "bool bssl::ssl_add_clienthello_tlsext(SSL_HANDSHAKE *, CBB *, CBB *, bool *, ssl_client_hello_type_t, size_t)"
                   );
    }
    pSVar1 = hs->ssl;
    iVar8 = CBB_add_u16_length_prefixed(out,&local_160);
    if (iVar8 == 0) {
      iVar8 = 0xf26;
      goto LAB_0023b02a;
    }
    (hs->extensions).sent = 0;
    if ((((pSVar1->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->field_0x288 & 0x20) != 0) {
      uVar7 = ssl_get_grease_value(hs,ssl_grease_extension1);
      bVar4 = add_padding_extension(&local_160,uVar7,0);
      if (!bVar4) {
        return false;
      }
    }
    uVar15 = 0;
    do {
      uVar14 = (hs->extension_permutation).size_;
      uVar16 = uVar15;
      if (uVar14 != 0) {
        if (uVar14 <= uVar15) goto LAB_0023b203;
        uVar16 = (ulong)(hs->extension_permutation).data_[uVar15];
      }
      sVar9 = CBB_len(&local_160);
      cVar5 = (**(code **)(&UNK_00432358 + uVar16 * 0x28))(hs,&local_160,&local_160,type);
      if (cVar5 == '\0') {
        ERR_put_error(0x10,0,0x93,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xf3d);
        ERR_add_error_dataf("extension %u",(ulong)(ushort)(&kExtensions)[uVar16 * 0x14]);
        return false;
      }
      sVar10 = CBB_len(&local_160);
      if (sVar10 != sVar9) {
        (hs->extensions).sent = (hs->extensions).sent | 1 << ((byte)uVar16 & 0x1f);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != 0x1c);
    bVar4 = sVar10 - sVar9 == 4;
    if ((((pSVar1->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->field_0x288 & 0x20) != 0) {
      uVar7 = ssl_get_grease_value(hs,ssl_grease_extension2);
      bVar6 = add_padding_extension(&local_160,uVar7,1);
      bVar4 = false;
      if (!bVar6) {
        return false;
      }
    }
    pSVar2 = hs->ssl;
    bVar6 = should_offer_psk(hs,type);
    if (bVar6) {
      md = (EVP_MD *)
           ssl_session_get_digest
                     ((pSVar2->session)._M_t.
                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
      iVar8 = EVP_MD_size(md);
      lVar18 = CONCAT44(extraout_var,iVar8) +
               *(size_t *)
                ((long)&((pSVar2->session)._M_t.
                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->ticket + 8) +
               0xf;
    }
    else {
      lVar18 = 0;
    }
    iVar8 = SSL_is_dtls(pSVar1);
    if (((iVar8 == 0) && (iVar8 = SSL_is_quic(pSVar1), iVar8 == 0)) &&
       ((pSVar1->s3->field_0xdd & 0x10) == 0)) {
      sVar9 = CBB_len(&local_160);
      uVar14 = sVar9 + header_len + lVar18 + 6;
      bVar17 = bVar4 & lVar18 == 0;
      uVar15 = sVar9 + 0xb + header_len + lVar18;
      if (bVar17 == 0) {
        uVar15 = uVar14;
      }
      if ((uVar15 & 0xffffffffffffff00) == 0x100) {
        sVar9 = 1;
        if (uVar14 < 0x1fc) {
          sVar9 = 0x1fc - uVar14;
          goto LAB_0023b146;
        }
      }
      else {
        sVar9 = (size_t)bVar17;
LAB_0023b146:
        if (sVar9 == 0) goto LAB_0023b162;
      }
      bVar4 = add_padding_extension(&local_160,0x15,sVar9);
      if (!bVar4) {
        return false;
      }
    }
LAB_0023b162:
    sVar9 = CBB_len(&local_160);
    bVar4 = ext_pre_shared_key_add_clienthello(hs,&local_160,out_needs_psk_binder,type);
    if (bVar4) {
      sVar10 = CBB_len(&local_160);
      if (lVar18 == sVar10 - sVar9) {
        sVar9 = CBB_len(&local_160);
        if (sVar9 == 0) {
          CBB_discard_child(out);
        }
        iVar8 = CBB_flush(out);
        return iVar8 != 0;
      }
      __assert_fail("psk_extension_len == CBB_len(&extensions) - len_before",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xf8a,
                    "bool bssl::ssl_add_clienthello_tlsext(SSL_HANDSHAKE *, CBB *, CBB *, bool *, ssl_client_hello_type_t, size_t)"
                   );
    }
    iVar8 = 0xf87;
LAB_0023b02a:
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,iVar8);
    return false;
  }
  pSVar1 = hs->ssl;
  CBB_zero(&local_160);
  CBB_zero(&local_f0);
  iVar8 = CBB_add_u16_length_prefixed(out,&local_120);
  if (((iVar8 == 0) || (iVar8 = CBB_add_u16_length_prefixed(out_encoded,&local_c0), iVar8 == 0)) ||
     ((iVar8 = CBB_init(&local_160,0x40), iVar8 == 0 ||
      (iVar8 = CBB_init(&local_f0,0x40), iVar8 == 0)))) {
    bVar4 = false;
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0xeba);
    goto LAB_0023aff2;
  }
  hs->inner_extensions_sent = 0;
  if ((((pSVar1->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->field_0x288 & 0x20) == 0) {
LAB_0023ab21:
    uVar15 = 0;
    local_130 = hs;
    local_128 = pSVar1;
    do {
      pSVar3 = local_130;
      uVar14 = (local_130->extension_permutation).size_;
      local_188 = uVar15;
      if (uVar14 != 0) {
        if (uVar14 <= uVar15) {
LAB_0023b203:
          abort();
        }
        local_188 = (ulong)(local_130->extension_permutation).data_[uVar15];
      }
      sVar9 = CBB_len(&local_120);
      sVar10 = CBB_len(&local_160);
      cVar5 = (**(code **)(&UNK_00432358 + local_188 * 0x28))(pSVar3,&local_120,&local_160,1);
      if (cVar5 == '\0') {
        ERR_put_error(0x10,0,0x93,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xed2);
        bVar4 = false;
        ERR_add_error_dataf("extension %u",(ulong)(ushort)(&kExtensions)[local_188 * 0x14]);
        goto LAB_0023aff2;
      }
      sVar11 = CBB_len(&local_120);
      sVar12 = CBB_len(&local_160);
      if (sVar12 != sVar10 && sVar11 != sVar9) {
        __assert_fail("bytes_written == 0 || bytes_written_compressed == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xedb,
                      "bool bssl::ssl_add_clienthello_tlsext_inner(SSL_HANDSHAKE *, CBB *, CBB *, bool *)"
                     );
      }
      if (sVar12 != sVar10 || sVar11 != sVar9) {
        local_130->inner_extensions_sent =
             local_130->inner_extensions_sent | 1 << ((byte)local_188 & 0x1f);
      }
      if ((sVar12 != sVar10) &&
         (iVar8 = CBB_add_u16(&local_f0,(&kExtensions)[local_188 * 0x14]), iVar8 == 0))
      goto LAB_0023b076;
      pSVar3 = local_130;
      uVar15 = uVar15 + 1;
    } while (uVar15 != 0x1c);
    if ((((local_128->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->field_0x288 & 0x20) != 0) {
      uVar7 = ssl_get_grease_value(local_130,ssl_grease_extension2);
      bVar4 = add_padding_extension(&local_160,uVar7,1);
      if ((!bVar4) || (iVar8 = CBB_add_u16(&local_f0,uVar7), iVar8 == 0)) goto LAB_0023b076;
    }
    puVar13 = CBB_data(&local_120);
    sVar9 = CBB_len(&local_120);
    iVar8 = CBB_add_bytes(&local_c0,puVar13,sVar9);
    if (iVar8 != 0) {
      sVar9 = CBB_len(&local_160);
      if (sVar9 == 0) {
LAB_0023adbe:
        sVar9 = CBB_len(&local_120);
        bVar4 = ext_pre_shared_key_add_clienthello
                          (pSVar3,&local_120,out_needs_psk_binder,ssl_client_hello_inner);
        if (bVar4) {
          puVar13 = CBB_data(&local_120);
          sVar10 = CBB_len(&local_120);
          iVar8 = CBB_add_bytes(&local_c0,puVar13 + sVar9,sVar10 - sVar9);
          if ((iVar8 != 0) && (iVar8 = CBB_flush(out), iVar8 != 0)) {
            iVar8 = CBB_flush(out_encoded);
            bVar4 = iVar8 != 0;
            goto LAB_0023aff2;
          }
        }
      }
      else {
        puVar13 = CBB_data(&local_160);
        sVar9 = CBB_len(&local_160);
        iVar8 = CBB_add_bytes(&local_120,puVar13,sVar9);
        if ((((iVar8 != 0) && (iVar8 = CBB_add_u16(&local_c0,0xfd00), iVar8 != 0)) &&
            (iVar8 = CBB_add_u16_length_prefixed(&local_c0,&local_60), iVar8 != 0)) &&
           (iVar8 = CBB_add_u8_length_prefixed(&local_60,&local_90), iVar8 != 0)) {
          puVar13 = CBB_data(&local_f0);
          sVar9 = CBB_len(&local_f0);
          iVar8 = CBB_add_bytes(&local_90,puVar13,sVar9);
          if ((iVar8 != 0) && (iVar8 = CBB_flush(&local_c0), iVar8 != 0)) goto LAB_0023adbe;
        }
      }
    }
  }
  else {
    uVar7 = ssl_get_grease_value(hs,ssl_grease_extension1);
    bVar4 = add_padding_extension(&local_160,uVar7,0);
    if ((bVar4) && (iVar8 = CBB_add_u16(&local_f0,uVar7), iVar8 != 0)) goto LAB_0023ab21;
  }
LAB_0023b076:
  bVar4 = false;
LAB_0023aff2:
  CBB_cleanup(&local_f0);
  CBB_cleanup(&local_160);
  return bVar4;
}

Assistant:

bool ssl_add_clienthello_tlsext(SSL_HANDSHAKE *hs, CBB *out, CBB *out_encoded,
                                bool *out_needs_psk_binder,
                                ssl_client_hello_type_t type,
                                size_t header_len) {
  *out_needs_psk_binder = false;

  if (type == ssl_client_hello_inner) {
    return ssl_add_clienthello_tlsext_inner(hs, out, out_encoded,
                                            out_needs_psk_binder);
  }

  assert(out_encoded == nullptr);  // Only ClientHelloInner needs two outputs.
  SSL *const ssl = hs->ssl;
  CBB extensions;
  if (!CBB_add_u16_length_prefixed(out, &extensions)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  // Note we may send multiple ClientHellos for DTLS HelloVerifyRequest and TLS
  // 1.3 HelloRetryRequest. For the latter, the extensions may change, so it is
  // important to reset this value.
  hs->extensions.sent = 0;

  // Add a fake empty extension. See RFC 8701.
  if (ssl->ctx->grease_enabled &&
      !add_padding_extension(
          &extensions, ssl_get_grease_value(hs, ssl_grease_extension1), 0)) {
    return false;
  }

  bool last_was_empty = false;
  for (size_t unpermuted = 0; unpermuted < kNumExtensions; unpermuted++) {
    size_t i = hs->extension_permutation.empty()
                   ? unpermuted
                   : hs->extension_permutation[unpermuted];
    const size_t len_before = CBB_len(&extensions);
    if (!kExtensions[i].add_clienthello(hs, &extensions, &extensions, type)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_ERROR_ADDING_EXTENSION);
      ERR_add_error_dataf("extension %u", (unsigned)kExtensions[i].value);
      return false;
    }

    const size_t bytes_written = CBB_len(&extensions) - len_before;
    if (bytes_written != 0) {
      hs->extensions.sent |= (1u << i);
    }
    // If the difference in lengths is only four bytes then the extension had
    // an empty body.
    last_was_empty = (bytes_written == 4);
  }

  if (ssl->ctx->grease_enabled) {
    // Add a fake non-empty extension. See RFC 8701.
    if (!add_padding_extension(
            &extensions, ssl_get_grease_value(hs, ssl_grease_extension2), 1)) {
      return false;
    }
    last_was_empty = false;
  }

  // In cleartext ClientHellos, we add the padding extension to work around
  // bugs. We also apply this padding to ClientHelloOuter, to keep the wire
  // images aligned.
  size_t psk_extension_len = ext_pre_shared_key_clienthello_length(hs, type);
  if (!SSL_is_dtls(ssl) && !SSL_is_quic(ssl) &&
      !ssl->s3->used_hello_retry_request) {
    header_len +=
        SSL3_HM_HEADER_LENGTH + 2 + CBB_len(&extensions) + psk_extension_len;
    size_t padding_len = 0;

    // The final extension must be non-empty. WebSphere Application
    // Server 7.0 is intolerant to the last extension being zero-length. See
    // https://crbug.com/363583.
    if (last_was_empty && psk_extension_len == 0) {
      padding_len = 1;
      // The addition of the padding extension may push us into the F5 bug.
      header_len += 4 + padding_len;
    }

    // Add padding to workaround bugs in F5 terminators. See RFC 7685.
    //
    // NB: because this code works out the length of all existing extensions
    // it MUST always appear last (save for any PSK extension).
    if (header_len > 0xff && header_len < 0x200) {
      // If our calculations already included a padding extension, remove that
      // factor because we're about to change its length.
      if (padding_len != 0) {
        header_len -= 4 + padding_len;
      }
      padding_len = 0x200 - header_len;
      // Extensions take at least four bytes to encode. Always include at least
      // one byte of data if including the extension. WebSphere Application
      // Server 7.0 is intolerant to the last extension being zero-length. See
      // https://crbug.com/363583.
      if (padding_len >= 4 + 1) {
        padding_len -= 4;
      } else {
        padding_len = 1;
      }
    }

    if (padding_len != 0 &&
        !add_padding_extension(&extensions, TLSEXT_TYPE_padding, padding_len)) {
      return false;
    }
  }

  // The PSK extension must be last, including after the padding.
  const size_t len_before = CBB_len(&extensions);
  if (!ext_pre_shared_key_add_clienthello(hs, &extensions, out_needs_psk_binder,
                                          type)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }
  assert(psk_extension_len == CBB_len(&extensions) - len_before);
  (void)len_before;  // |assert| is omitted in release builds.

  // Discard empty extensions blocks.
  if (CBB_len(&extensions) == 0) {
    CBB_discard_child(out);
  }

  return CBB_flush(out);
}